

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O0

bool __thiscall
ctemplate::Template::BuildTree(Template *this,char *input_buffer,char *input_buffer_end)

{
  bool bVar1;
  TemplateState TVar2;
  SectionTemplateNode *this_00;
  TemplateToken local_80;
  SectionTemplateNode *local_50;
  SectionTemplateNode *top_node;
  size_t sStack_40;
  char *local_38;
  size_t sStack_30;
  char *local_28;
  char *input_buffer_end_local;
  char *input_buffer_local;
  Template *this_local;
  
  local_28 = input_buffer_end;
  input_buffer_end_local = input_buffer;
  input_buffer_local = (char *)this;
  set_state(this,TS_EMPTY);
  (this->parse_state_).bufstart = input_buffer_end_local;
  (this->parse_state_).bufend = local_28;
  (this->parse_state_).phase = GETTING_TEXT;
  MarkerDelimiters::MarkerDelimiters((MarkerDelimiters *)&top_node);
  (this->parse_state_).current_delimiters.end_marker = local_38;
  (this->parse_state_).current_delimiters.end_marker_len = sStack_30;
  (this->parse_state_).current_delimiters.start_marker = (char *)top_node;
  (this->parse_state_).current_delimiters.start_marker_len = sStack_40;
  this_00 = (SectionTemplateNode *)operator_new(0xa0);
  TemplateToken::TemplateToken
            (&local_80,TOKENTYPE_SECTION_START,"__{{MAIN}}__",0xc,
             (vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_> *)
             0x0);
  SectionTemplateNode::SectionTemplateNode(this_00,&local_80,false);
  TemplateToken::~TemplateToken(&local_80);
  local_50 = this_00;
  do {
    bVar1 = SectionTemplateNode::AddSubnode(local_50,this);
  } while (bVar1);
  if (this->tree_ != (SectionTemplateNode *)0x0) {
    (*(this->tree_->super_TemplateNode)._vptr_TemplateNode[1])();
  }
  if (this->template_text_ != (char *)0x0) {
    operator_delete__(this->template_text_);
  }
  this->tree_ = local_50;
  this->template_text_ = input_buffer_end_local;
  this->template_text_len_ = (int)local_28 - (int)input_buffer_end_local;
  TVar2 = state(this);
  if (TVar2 == TS_ERROR) {
    if (this->tree_ != (SectionTemplateNode *)0x0) {
      (*(this->tree_->super_TemplateNode)._vptr_TemplateNode[1])();
    }
    this->tree_ = (SectionTemplateNode *)0x0;
    if (this->template_text_ != (char *)0x0) {
      operator_delete__(this->template_text_);
    }
    this->template_text_ = (char *)0x0;
    this->template_text_len_ = 0;
    this_local._7_1_ = false;
  }
  else {
    set_state(this,TS_READY);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Template::BuildTree(const char* input_buffer,
                         const char* input_buffer_end) {
  set_state(TS_EMPTY);
  parse_state_.bufstart = input_buffer;
  parse_state_.bufend = input_buffer_end;
  parse_state_.phase = ParseState::GETTING_TEXT;
  parse_state_.current_delimiters = Template::MarkerDelimiters();
  // Assign an arbitrary name to the top-level node
  SectionTemplateNode *top_node = new SectionTemplateNode(
      TemplateToken(TOKENTYPE_SECTION_START,
                    kMainSectionName, strlen(kMainSectionName), NULL),
      false);
  while (top_node->AddSubnode(this)) {
    // Add the rest of the template in.
  }

  // get rid of the old tree, whenever we try to build a new one.
  delete tree_;
  delete[] template_text_;
  tree_ = top_node;
  template_text_ = input_buffer;
  template_text_len_ = input_buffer_end - input_buffer;

  // TS_ERROR can also be set by the auto-escape mode, at the point
  // where the parser failed to parse.
  if (state() != TS_ERROR) {
    set_state(TS_READY);
    return true;
  } else {
    delete tree_;
    tree_ = NULL;
    delete[] template_text_;
    template_text_ = NULL;
    template_text_len_ = 0;
    return false;
  }
}